

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnnvalue * parsevalue(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *__s1;
  rnndb *db_00;
  int iVar1;
  rnnvalue *prVar2;
  char *pcVar3;
  char *pcVar4;
  uint64_t uVar5;
  xmlNode *node_00;
  _xmlAttr *attr;
  _xmlNode *node_01;
  bool bVar6;
  
  prVar2 = (rnnvalue *)calloc(0x68,1);
  prVar2->file = file;
  attr = node->properties;
  if (attr == (_xmlAttr *)0x0) {
    bVar6 = true;
  }
  else {
    pcVar4 = (char *)0x0;
    do {
      __s1 = attr->name;
      iVar1 = strcmp((char *)__s1,"name");
      if (iVar1 == 0) {
        pcVar4 = getattrib(db,file,(uint)node->line,attr);
        pcVar4 = strdup(pcVar4);
        prVar2->name = pcVar4;
      }
      else {
        iVar1 = strcmp((char *)__s1,"value");
        if (iVar1 == 0) {
          uVar5 = getnumattrib(db,file,(uint)node->line,attr);
          prVar2->value = uVar5;
          prVar2->valvalid = 1;
        }
        else {
          iVar1 = strcmp((char *)__s1,"varset");
          if (iVar1 == 0) {
            pcVar3 = getattrib(db,file,(uint)node->line,attr);
            pcVar3 = strdup(pcVar3);
            (prVar2->varinfo).varsetstr = pcVar3;
          }
          else {
            iVar1 = strcmp((char *)__s1,"variants");
            if (iVar1 == 0) {
              pcVar3 = getattrib(db,file,(uint)node->line,attr);
              pcVar3 = strdup(pcVar3);
              (prVar2->varinfo).variantsstr = pcVar3;
            }
            else {
              fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for value\n",file,(ulong)node->line,
                      __s1);
              db->estatus = 1;
            }
          }
        }
      }
      attr = attr->next;
    } while (attr != (_xmlAttr *)0x0);
    bVar6 = pcVar4 == (char *)0x0;
  }
  for (node_01 = node->children; node_01 != (xmlNode *)0x0; node_01 = node_01->next) {
    if (node_01->type == XML_ELEMENT_NODE) {
      pcVar4 = file;
      iVar1 = trytop(db,file,node_01);
      if (iVar1 == 0) {
        db_00 = (rnndb *)node_01->name;
        iVar1 = trydoc(db_00,pcVar4,node_00);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)node_01->line,node->name,
                  db_00);
          db->estatus = 1;
        }
      }
    }
  }
  if (bVar6) {
    prVar2 = (rnnvalue *)0x0;
    fprintf(_stderr,"%s:%d: nameless value\n",file,(ulong)node->line);
    db->estatus = 1;
  }
  return prVar2;
}

Assistant:

static struct rnnvalue *parsevalue(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnvalue *val = calloc(sizeof *val, 1);
	val->file = file;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			val->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "value")) {
			val->value = getnumattrib(db, file, node->line, attr);
			val->valvalid = 1;
		} else if (!strcmp(attr->name, "varset")) {
			val->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			val->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for value\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!val->name) {
		fprintf (stderr, "%s:%d: nameless value\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return val;
	}
}